

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_xml.cpp
# Opt level: O0

float __thiscall ON_XMLVariant::AsFloat(ON_XMLVariant *this)

{
  bool bVar1;
  wchar_t *s;
  double dVar2;
  float local_2c;
  ON_XMLVariant *this_local;
  
  switch(this->_private->_type) {
  case Bool:
    local_2c = 1.0;
    if (((this->_private->field_2)._bool_val & 1U) == 0) {
      local_2c = 0.0;
    }
    this_local._4_4_ = local_2c;
    break;
  case Integer:
    this_local._4_4_ = (float)(this->_private->field_2)._int_val;
    break;
  case Float:
    this_local._4_4_ = (this->_private->field_2)._float_val;
    break;
  case Double:
    this_local._4_4_ = (float)(this->_private->field_2)._double_val;
    break;
  case String:
    bVar1 = IsValidRealNumber(&this->_private->_string_val);
    if (bVar1) {
      s = ON_wString::operator_cast_to_wchar_t_(&this->_private->_string_val);
      dVar2 = ON_wtof(s);
      return (float)dVar2;
    }
  default:
    this_local._4_4_ = 0.0;
  }
  return this_local._4_4_;
}

Assistant:

float ON_XMLVariant::AsFloat(void) const
{
  switch (_private->_type)
  {
  case Types::Bool:    return       _private->_bool_val ? 1.0f : 0.0f;
  case Types::Float:   return       _private->_float_val;
  case Types::Double:  return float(_private->_double_val);
  case Types::Integer: return float(_private->_int_val);
  case Types::String:
    if (IsValidRealNumber(_private->_string_val))
      return float(ON_wtof(_private->_string_val));

  default:
    return 0.0f;
  }
}